

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Token * __thiscall JSON::Parser::readNumberToken(Token *__return_storage_ptr__,Parser *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 extraout_RAX;
  byte bVar11;
  byte bVar12;
  int iVar13;
  string value;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar5 = this->pos;
  uVar9 = uVar5;
  if ((this->input)._M_dataplus._M_p[(int)uVar5] == '-') {
    uVar9 = uVar5 + 1;
    this->pos = uVar9;
  }
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < this->length) {
    psVar1 = &this->input;
    bVar7 = true;
    iVar13 = 0;
    bVar12 = 0;
    bVar11 = 0;
    do {
      bVar3 = (psVar1->_M_dataplus)._M_p[(int)uVar10];
      bVar8 = isNumberChar((uint)bVar3);
      if (bVar8) {
        bVar11 = bVar11 | iVar13 == 0;
        bVar12 = bVar12 | iVar13 == 0;
        uVar9 = this->pos + 1;
        bVar7 = false;
LAB_001065ff:
        uVar10 = (ulong)uVar9;
        this->pos = uVar9;
      }
      else {
        if (bVar7) break;
        if ((bool)(~bVar11 & 1 | (bVar3 & 0xffffffdf) != 0x45)) {
          if (!(bool)(~bVar12 & 1 | bVar3 != 0x2e)) {
            uVar9 = this->pos + 1;
LAB_001065fc:
            bVar7 = true;
            bVar12 = 0;
            goto LAB_001065ff;
          }
          break;
        }
        iVar6 = this->pos;
        uVar10 = (long)iVar6 + 1;
        this->pos = (int)uVar10;
        bVar7 = true;
        if (((int)uVar10 < this->length) &&
           ((cVar4 = (psVar1->_M_dataplus)._M_p[uVar10], cVar4 == '-' || (cVar4 == '+')))) {
          uVar9 = iVar6 + 2;
          bVar11 = 0;
          goto LAB_001065fc;
        }
        bVar11 = 0;
        bVar12 = 0;
      }
      iVar13 = iVar13 + -1;
    } while ((int)uVar10 < this->length);
    if (!bVar7) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,local_48 + (long)local_50);
      iVar13 = this->pos;
      __return_storage_ptr__->type = NUMBER;
      paVar2 = &(__return_storage_ptr__->value).field_2;
      (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar2;
      if (local_70 == &local_60) {
        paVar2->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
        *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_58;
      }
      else {
        (__return_storage_ptr__->value)._M_dataplus._M_p = local_70;
        (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60)
        ;
      }
      (__return_storage_ptr__->value)._M_string_length = local_68;
      local_68 = 0;
      local_60 = '\0';
      __return_storage_ptr__->start = uVar5;
      __return_storage_ptr__->end = iVar13;
      if (local_50 != local_40) {
        local_70 = &local_60;
        operator_delete(local_50,local_40[0] + 1);
      }
      return __return_storage_ptr__;
    }
  }
  unexpected(this,TYPE_NUMBER,this->pos);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token Parser::readNumberToken() {
        int chunkStart = pos;
        int count = 0;
        bool allowDot = false;
        bool allowE = false;
        bool expectNumber = true;
        int code = getCodeAt(pos);

        if (code == 45) { // '-'
            pos++;
        }

        while (isValidPos()) {
            code = getCodeAt(pos);
            count++;

            if (isNumberChar(code)) {
                if (count == 1) {
                    allowDot = true;
                    allowE = true;
                }
                expectNumber = false;
                pos++;
            } else if (expectNumber) {
                break;
            } else if (allowE && (code == 69 || code == 101)) { // 'E' or 'e'
                allowE = false;
                allowDot = false;
                expectNumber = true;
                pos++;
                if (isValidPos() && (getCodeAt(pos) == 43 || getCodeAt(pos) == 45)) { // '+' or '-'
                    pos++;
                }
            } else if (allowDot && code == 46) { // '.'
                allowDot = false;
                expectNumber = true;
                pos++;
            } else {
                break;
            }
        }

        // check
        if (expectNumber) {
            unexpected(TYPE_NUMBER, pos);
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(NUMBER, value, chunkStart, pos);
    }